

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O1

void __thiscall wasm::Precompute::visitExpression(Precompute *this,Expression *curr)

{
  Id IVar1;
  ulong uVar2;
  Module *module;
  Flow *pFVar3;
  Builder this_00;
  bool bVar4;
  Expression *pEVar5;
  Break *expression;
  Expression *expression_00;
  ulong uVar6;
  byte unaff_R12B;
  Nop *output;
  Name name;
  Flow local_118;
  Flow local_d0;
  Builder local_88;
  Builder builder;
  undefined1 local_78 [8];
  Flow flow;
  
  bVar4 = Properties::isSingleConstantExpression(curr);
  if (bVar4) {
    return;
  }
  IVar1 = curr->_id;
  builder.wasm = (Module *)this;
  if (IVar1 == TupleMakeId) {
    uVar2 = curr[1].type.id;
    unaff_R12B = uVar2 == 0;
    if (!(bool)unaff_R12B) {
      uVar6 = 0;
      do {
        if (curr[1].type.id <= uVar6) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        bVar4 = Properties::isSingleConstantExpression
                          (*(Expression **)(*(long *)(curr + 1) + uVar6 * 8));
        if (!bVar4) break;
        uVar6 = uVar6 + 1;
        unaff_R12B = uVar2 == uVar6;
      } while (!(bool)unaff_R12B);
    }
  }
  this_00.wasm = builder.wasm;
  if ((IVar1 == TupleMakeId & unaff_R12B) != 0) {
    return;
  }
  if (curr->_id == NopId) {
    return;
  }
  precomputeExpression((Flow *)local_78,(Precompute *)builder.wasm,curr,true);
  bVar4 = canEmitConstantFor((Precompute *)this_00.wasm,(Literals *)local_78);
  if (bVar4) {
    if (flow.breakTo.super_IString.str._M_len == 0) {
      if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3)
          * -0x5555555555555555 + (long)local_78 == 0) {
        curr->_id = NopId;
        (curr->type).id = 0;
      }
      else {
        pEVar5 = Flow::getConstExpression
                           ((Flow *)local_78,
                            (Module *)((this_00.wasm)->debugInfoSourceRoot)._M_string_length);
        Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
        replaceCurrent((Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                        *)&((this_00.wasm)->tags).
                           super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar5);
      }
    }
    else if (flow.breakTo.super_IString.str._M_len == DAT_010d2618) {
      considerPartiallyPrecomputing((Precompute *)this_00.wasm,curr);
    }
    else {
      if (flow.breakTo.super_IString.str._M_len == DAT_010d25f8) {
        if (curr->_id != ReturnId) {
          module = (Module *)((this_00.wasm)->debugInfoSourceRoot)._M_string_length;
          if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                     flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
              3) * -0x5555555555555555 + (long)local_78 == 0) {
            pEVar5 = (Expression *)0x0;
          }
          else {
            pEVar5 = Flow::getConstExpression((Flow *)local_78,module);
          }
          expression_00 = (Expression *)MixedArena::allocSpace(&module->allocator,0x18,8);
          expression_00->_id = ReturnId;
          (expression_00->type).id = 0;
          *(undefined8 *)(expression_00 + 1) = 0;
          (expression_00->type).id = 1;
          *(Expression **)(expression_00 + 1) = pEVar5;
          Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
          replaceCurrent((Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                          *)&((this_00.wasm)->tags).
                             super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,expression_00);
          goto LAB_00a220ea;
        }
        SmallVector<wasm::Literal,_1UL>::SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&local_118,
                   (SmallVector<wasm::Literal,_1UL> *)local_78);
        local_118.breakTo.super_IString.str._M_len =
             (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        local_118.breakTo.super_IString.str._M_str = (char *)flow.breakTo.super_IString.str._M_len;
        reuseConstantNode<wasm::Return>((Precompute *)this_00.wasm,(Return *)curr,&local_118);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&local_118.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
        pFVar3 = &local_118;
      }
      else {
        if (curr->_id != BreakId) {
          local_88.wasm = (Module *)((this_00.wasm)->debugInfoSourceRoot)._M_string_length;
          if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                     flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
              3) * -0x5555555555555555 + (long)local_78 == 0) {
            pEVar5 = (Expression *)0x0;
          }
          else {
            pEVar5 = Flow::getConstExpression((Flow *)local_78,local_88.wasm);
          }
          name.super_IString.str._M_str = (char *)flow.breakTo.super_IString.str._M_len;
          name.super_IString.str._M_len =
               (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          expression = Builder::makeBreak(&local_88,name,pEVar5,(Expression *)0x0);
          Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
          replaceCurrent((Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                          *)&((this_00.wasm)->tags).
                             super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Expression *)expression);
          goto LAB_00a220ea;
        }
        *(pointer *)(curr + 1) =
             flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        curr[1].type.id = flow.breakTo.super_IString.str._M_len;
        curr[2].type.id = 0;
        SmallVector<wasm::Literal,_1UL>::SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&local_d0,
                   (SmallVector<wasm::Literal,_1UL> *)local_78);
        local_d0.breakTo.super_IString.str._M_len =
             (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        local_d0.breakTo.super_IString.str._M_str = (char *)flow.breakTo.super_IString.str._M_len;
        reuseConstantNode<wasm::Break>((Precompute *)this_00.wasm,(Break *)curr,&local_d0);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&local_d0.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
        pFVar3 = &local_d0;
      }
      Literal::~Literal((pFVar3->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    }
  }
LAB_00a220ea:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&flow);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // TODO: if local.get, only replace with a constant if we don't care about
    // size...?
    if (Properties::isConstantExpression(curr) || curr->is<Nop>()) {
      return;
    }
    // try to evaluate this into a const
    Flow flow = precomputeExpression(curr);
    if (!canEmitConstantFor(flow.values)) {
      return;
    }
    if (flow.breaking()) {
      if (flow.breakTo == NONCONSTANT_FLOW) {
        // This cannot be turned into a constant, but perhaps we can partially
        // precompute it.
        considerPartiallyPrecomputing(curr);
        return;
      }
      if (flow.breakTo == RETURN_FLOW) {
        // this expression causes a return. if it's already a return, reuse the
        // node
        if (auto* ret = curr->dynCast<Return>()) {
          reuseConstantNode(ret, flow);
        } else {
          Builder builder(*getModule());
          replaceCurrent(builder.makeReturn(
            flow.values.isConcrete() ? flow.getConstExpression(*getModule())
                                     : nullptr));
        }
        return;
      }
      // this expression causes a break, emit it directly. if it's already a br,
      // reuse the node.
      if (auto* br = curr->dynCast<Break>()) {
        br->name = flow.breakTo;
        br->condition = nullptr;
        reuseConstantNode(br, flow);
      } else {
        Builder builder(*getModule());
        replaceCurrent(builder.makeBreak(
          flow.breakTo,
          flow.values.isConcrete() ? flow.getConstExpression(*getModule())
                                   : nullptr));
      }
      return;
    }
    // this was precomputed
    if (flow.values.isConcrete()) {
      replaceCurrent(flow.getConstExpression(*getModule()));
    } else {
      ExpressionManipulator::nop(curr);
    }
  }